

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O0

void __thiscall
flatbuffers::anon_unknown_25::LuaBfbsGenerator::~LuaBfbsGenerator(LuaBfbsGenerator *this)

{
  LuaBfbsGenerator *this_local;
  
  (this->super_BaseBfbsGenerator).super_CodeGenerator._vptr_CodeGenerator =
       (_func_int **)&PTR__LuaBfbsGenerator_004fb888;
  BfbsNamer::~BfbsNamer(&this->namer_);
  std::__cxx11::string::~string((string *)&this->flatc_version_);
  CodeGenOptions::~CodeGenOptions(&this->options_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->requires_);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&this->keywords_);
  BaseBfbsGenerator::~BaseBfbsGenerator(&this->super_BaseBfbsGenerator);
  return;
}

Assistant:

explicit LuaBfbsGenerator(const std::string &flatc_version)
      : BaseBfbsGenerator(),
        keywords_(),
        requires_(),
        current_obj_(nullptr),
        current_enum_(nullptr),
        flatc_version_(flatc_version),
        namer_(LuaDefaultConfig(), LuaKeywords()) {}